

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

uint AddBaseClassMemberVariables
               (ExpressionContext *ctx,SynBase *syntax,TypeClass *baseClass,TypeClass *newClass)

{
  longlong *plVar1;
  uint alignment;
  uint uniqueId;
  MemberHandle *pMVar2;
  SynIdentifier *pSVar3;
  VariableData *pVVar4;
  TypeBase *type;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  MemberHandle *node;
  ulong uVar8;
  uint uVar9;
  char *in_R8;
  IntrusiveList<MemberHandle> *pIVar10;
  InplaceStr name;
  InplaceStr local_40;
  VariableData *this;
  undefined4 extraout_var_00;
  
  uVar9 = 0;
  uVar6 = 0;
  if (baseClass->baseClass != (TypeClass *)0x0) {
    uVar6 = AddBaseClassMemberVariables(ctx,syntax,baseClass->baseClass,newClass);
  }
  pIVar10 = &(baseClass->super_TypeStruct).members;
  do {
    pMVar2 = pIVar10->head;
    if (pMVar2 == (MemberHandle *)0x0) {
      uVar8 = (ulong)(baseClass->super_TypeStruct).super_TypeBase.padding;
      plVar1 = &((newClass->super_TypeStruct).typeScope)->dataSize;
      *plVar1 = *plVar1 + uVar8;
      plVar1 = &(newClass->super_TypeStruct).super_TypeBase.size;
      *plVar1 = *plVar1 + uVar8;
      return uVar9;
    }
    local_40.begin = "$typeid";
    local_40.end = "";
    bVar5 = InplaceStr::operator==(&pMVar2->variable->name->name,&local_40);
    if (!bVar5) {
      uVar9 = uVar9 + 1;
      if (uVar6 == 0) {
        pSVar3 = pMVar2->variable->name;
        name.end = in_R8;
        name.begin = (pSVar3->name).end;
        bVar5 = anon_unknown.dwarf_94284::CheckVariableConflict
                          ((anon_unknown_dwarf_94284 *)ctx,(ExpressionContext *)syntax,
                           (SynBase *)(pSVar3->name).begin,name);
        uVar6 = anon_unknown.dwarf_94284::AllocateVariableInScope
                          (ctx,syntax,pMVar2->variable->alignment,pMVar2->variable->type);
        if (uVar6 != pMVar2->variable->offset) {
          __assert_fail("offset == el->variable->offset",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x2981,
                        "unsigned int AddBaseClassMemberVariables(ExpressionContext &, SynBase *, TypeClass *, TypeClass *)"
                       );
        }
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
        this = (VariableData *)CONCAT44(extraout_var,iVar7);
        pVVar4 = pMVar2->variable;
        alignment = pVVar4->alignment;
        in_R8 = (char *)(ulong)alignment;
        type = pVVar4->type;
        pSVar3 = pVVar4->name;
        uniqueId = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uniqueId + 1;
        VariableData::VariableData
                  (this,ctx->allocator,syntax,ctx->scope,alignment,type,pSVar3,uVar6,uniqueId);
        if (!bVar5) {
          ExpressionContext::AddVariable(ctx,this,true);
        }
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
        node = (MemberHandle *)CONCAT44(extraout_var_00,iVar7);
        node->source = pMVar2->variable->source;
        node->variable = this;
        node->initializer = (SynBase *)0x0;
        node->next = (MemberHandle *)0x0;
        node->listed = false;
        IntrusiveList<MemberHandle>::push_back(&(newClass->super_TypeStruct).members,node);
        uVar6 = 0;
      }
      else {
        uVar6 = uVar6 - 1;
      }
    }
    pIVar10 = (IntrusiveList<MemberHandle> *)&pMVar2->next;
  } while( true );
}

Assistant:

unsigned AddBaseClassMemberVariables(ExpressionContext &ctx, SynBase *syntax, TypeClass *baseClass, TypeClass *newClass)
{
	unsigned skipBaseMembers = 0;

	if(baseClass->baseClass)
		skipBaseMembers = AddBaseClassMemberVariables(ctx, syntax, baseClass->baseClass, newClass);

	unsigned skipMembers = 0;

	for(MemberHandle *el = baseClass->members.head; el; el = el->next)
	{
		if(el->variable->name->name == InplaceStr("$typeid"))
			continue;

		skipMembers++;

		if(skipBaseMembers > 0)
		{
			skipBaseMembers--;
			continue;
		}

		bool conflict = CheckVariableConflict(ctx, syntax, el->variable->name->name);

		unsigned offset = AllocateVariableInScope(ctx, syntax, el->variable->alignment, el->variable->type);

		assert(offset == el->variable->offset);

		VariableData *member = new (ctx.get<VariableData>()) VariableData(ctx.allocator, syntax, ctx.scope, el->variable->alignment, el->variable->type, el->variable->name, offset, ctx.uniqueVariableId++);

		if(!conflict)
			ctx.AddVariable(member, true);

		newClass->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(el->variable->source, member, NULL));
	}

	// Add padding from base class
	newClass->typeScope->dataSize += baseClass->padding;
	newClass->size += baseClass->padding;

	return skipMembers;
}